

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::should_suppress_usage_tracking(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  
  bVar1 = expression_is_forwarded(this,id);
  if (bVar1) {
    bVar1 = expression_suppresses_usage_tracking(this,id);
    return bVar1;
  }
  return true;
}

Assistant:

bool CompilerGLSL::should_suppress_usage_tracking(uint32_t id) const
{
	// Used only by opcodes which don't do any real "work", they just swizzle data in some fashion.
	return !expression_is_forwarded(id) || expression_suppresses_usage_tracking(id);
}